

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

int pstore::serialize::read<int,(anonymous_namespace)::ArchiveSpan::mock_span_archive&>
              (mock_span_archive *archive)

{
  unique_ptr<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  local_30;
  unique_ptr<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  d;
  anon_class_1_0_00000001_for__M_head_impl dtor;
  T2 *t2;
  mock_span_archive *pmStack_10;
  type uninit_buffer;
  mock_span_archive *archive_local;
  
  pmStack_10 = archive;
  flood<pstore::serialize::details::aligned_storage<4ul,4ul>::type>((type *)((long)&t2 + 4));
  read_uninit<(anonymous_namespace)::ArchiveSpan::mock_span_archive&,int>
            (pmStack_10,(pointer)((long)&t2 + 4));
  std::
  unique_ptr<int,pstore::serialize::read<int,(anonymous_namespace)::ArchiveSpan::mock_span_archive&>((anonymous_namespace)::ArchiveSpan::mock_span_archive&)::{lambda(int*)#1}>
  ::
  unique_ptr<pstore::serialize::read<int,(anonymous_namespace)::ArchiveSpan::mock_span_archive&>((anonymous_namespace)::ArchiveSpan::mock_span_archive&)::_lambda(int*)_1_,void>
            ((unique_ptr<int,pstore::serialize::read<int,(anonymous_namespace)::ArchiveSpan::mock_span_archive&>((anonymous_namespace)::ArchiveSpan::mock_span_archive&)::_lambda(int*)_1_>
              *)&local_30,(pointer)((long)&t2 + 4),
             (deleter_type *)
             ((long)&d._M_t.
                     super___uniq_ptr_impl<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
                     ._M_t.
                     super__Tuple_impl<0UL,_int_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
                     .super__Head_base<0UL,_int_*,_false>._M_head_impl + 7));
  std::
  unique_ptr<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/types.hpp:422:25)>
  ::~unique_ptr(&local_30);
  return t2._4_4_;
}

Assistant:

Ty read (Archive && archive) {
            using T2 = typename std::remove_const<Ty>::type;
            typename details::aligned_storage<sizeof (T2), alignof (T2)>::type uninit_buffer;
            flood (&uninit_buffer);

            // Deserialize into the uninitialized buffer.
            auto & t2 = reinterpret_cast<T2 &> (uninit_buffer);
            read_uninit (std::forward<Archive> (archive), t2);

            // This object will destroy the remains of the T2 instance in uninit_buffer.
            auto dtor = [] (T2 * p) { p->~T2 (); };
            std::unique_ptr<T2, decltype (dtor)> d (&t2, dtor);
            return std::move (t2);
        }